

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O1

void __thiscall
agge::tests::RendererTests::RenderingTwoBoundingCellsProducesSpan(RendererTests *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int cover_2;
  int iVar4;
  int cover;
  uint uVar5;
  scanline_mockup sl2;
  scanline_mockup sl1;
  string local_c8;
  LocationInfo local_a8;
  scanline_mockup local_80;
  scanline_mockup local_58;
  
  local_58.excepted_y = -1000000;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._inprogress = true;
  local_58._current_y = 0x7fffffff;
  local_80.excepted_y = -1000000;
  local_80.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._inprogress = true;
  local_80._current_y = 0x7fffffff;
  uVar5 = 0;
  do {
    iVar4 = *(int *)((long)&DAT_001a1250 + lVar3);
    iVar2 = 0;
    do {
      lVar1 = lVar3;
      lVar3 = lVar1 + 0xc;
      iVar2 = iVar2 + *(int *)((long)&DAT_001a1254 + lVar1);
      uVar5 = uVar5 + *(int *)((long)&DAT_001a1258 + lVar1);
      if (lVar3 == 0x18) break;
    } while (*(int *)((long)&DAT_001a125c + lVar1) == iVar4);
    if (iVar2 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&local_58,iVar4,uVar5 * 0x200 - iVar2);
      iVar4 = iVar4 + 1;
    }
    if (lVar3 == 0x18) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0xc2);
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                ((span (*) [1])&DAT_001a0aa0,&local_58.spans_log,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.filename._M_dataplus._M_p != &local_a8.filename.field_2) {
        operator_delete(local_a8.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      lVar3 = 0;
      uVar5 = 0;
      do {
        iVar4 = *(int *)((long)&DAT_001a1270 + lVar3);
        iVar2 = 0;
        do {
          lVar1 = lVar3;
          lVar3 = lVar1 + 0xc;
          iVar2 = iVar2 + *(int *)((long)&DAT_001a1274 + lVar1);
          uVar5 = uVar5 + *(int *)((long)&DAT_001a1278 + lVar1);
          if (lVar3 == 0x18) break;
        } while (*(int *)((long)&DAT_001a127c + lVar1) == iVar4);
        if (iVar2 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_80,iVar4,uVar5 * 0x200 - iVar2);
          iVar4 = iVar4 + 1;
        }
        if (lVar3 == 0x18) {
          lVar3 = 0;
          uVar5 = 0;
          do {
            iVar4 = *(int *)((long)&DAT_001a1290 + lVar3);
            iVar2 = 0;
            do {
              lVar1 = lVar3;
              lVar3 = lVar1 + 0xc;
              iVar2 = iVar2 + *(int *)((long)&DAT_001a1294 + lVar1);
              uVar5 = uVar5 + *(int *)((long)&DAT_001a1298 + lVar1);
              if (lVar3 == 0x18) break;
            } while (*(int *)((long)&DAT_001a129c + lVar1) == iVar4);
            if (iVar2 != 0) {
              anon_unknown_1::scanline_mockup::add_cell(&local_80,iVar4,uVar5 * 0x200 - iVar2);
              iVar4 = iVar4 + 1;
            }
            if (lVar3 == 0x18) {
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                         ,"");
              ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0xce);
              ut::
              are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                        ((span (*) [2])&DAT_001a1a80,&local_80.spans_log,&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8.filename._M_dataplus._M_p != &local_a8.filename.field_2) {
                operator_delete(local_a8.filename._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if (local_80.spans_log.
                  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_80.spans_log.
                                super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_58.spans_log.
                  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_58.spans_log.
                                super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              return;
            }
            iVar2 = *(int *)((long)&DAT_001a129c + lVar1) - iVar4;
            if ((iVar2 != 0) && ((uVar5 & 0x7fffff) != 0)) {
              anon_unknown_1::scanline_mockup::add_span(&local_80,iVar4,iVar2,uVar5 * 0x200);
            }
          } while( true );
        }
        iVar2 = *(int *)((long)&DAT_001a127c + lVar1) - iVar4;
        if ((iVar2 != 0) && ((uVar5 & 0x7fffff) != 0)) {
          anon_unknown_1::scanline_mockup::add_span(&local_80,iVar4,iVar2,uVar5 * 0x200);
        }
      } while( true );
    }
    iVar2 = *(int *)((long)&DAT_001a125c + lVar1) - iVar4;
    if ((iVar2 != 0) && ((uVar5 & 0x7fffff) != 0)) {
      anon_unknown_1::scanline_mockup::add_span(&local_58,iVar4,iVar2,uVar5 * 0x200);
    }
  } while( true );
}

Assistant:

test( RenderingTwoBoundingCellsProducesSpan )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 8, 0, 17 }, { 13, 0, -17 }, };
				mocks::cell cells2[] = { { 11, 0, 255 }, { 199, 0, -255 }, };
				mocks::cell cells3[] = { { 1300011, 0, -100 }, { 1302010, 0, 100 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = {
					{ 0x7fffffff, 8, 5, 17 * 512 },
				};

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());
				sweep_scanline<8>(sl2, begin(cells3), end(cells3), bypass_alpha());

				// ASSERT
				span reference2[] = {
					{ 0x7fffffff, 11, 188, 255 * 512 },
					{ 0x7fffffff, 1300011, 1999, -100 * 512 },
				};

				assert_equal(reference2, sl2.spans_log);
			}